

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

char * __thiscall
CoreML::Specification::BayesianProbitRegressor::_InternalParse
          (BayesianProbitRegressor *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  ParseContext *pPVar1;
  bool bVar2;
  undefined1 uVar3;
  uint32_t uVar4;
  BayesianProbitRegressor_Gaussian *msg;
  BayesianProbitRegressor_FeatureWeight *msg_00;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  string *str_7;
  string *str_6;
  string *str_5;
  string *str_4;
  string *str_3;
  string *str_2;
  string *str_1;
  string *str;
  ParseContext *pPStack_20;
  uint32_t tag;
  ParseContext *ctx_local;
  char *ptr_local;
  BayesianProbitRegressor *this_local;
  
  pPStack_20 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
LAB_0047dddf:
  do {
    bVar2 = google::protobuf::internal::ParseContext::Done(pPStack_20,(char **)&ctx_local);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return (char *)ctx_local;
    }
    ctx_local = (ParseContext *)
                google::protobuf::internal::ReadTag
                          ((char *)ctx_local,(uint32_t *)((long)&str + 4),0);
    pPVar1 = pPStack_20;
    tag_00 = str._4_4_;
    switch(str._4_4_ >> 3) {
    case 1:
      if ((str._4_4_ & 0xff) != 8) break;
      uVar4 = google::protobuf::internal::ReadVarint32((char **)&ctx_local);
      this->numberoffeatures_ = uVar4;
      goto joined_r0x0047e27f;
    case 2:
      if ((str._4_4_ & 0xff) == 0x12) {
        msg = _internal_mutable_bias(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::ParseContext::ParseMessage
                              (pPVar1,&msg->super_MessageLite,(char *)ctx_local);
        goto joined_r0x0047e27f;
      }
      break;
    case 3:
      if ((str._4_4_ & 0xff) == 0x1a) {
        ctx_local = (ParseContext *)((long)&ctx_local[-1].data_.arena + 7);
        do {
          pPVar1 = pPStack_20;
          ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 1);
          msg_00 = _internal_add_features(this);
          ctx_local = (ParseContext *)
                      google::protobuf::internal::ParseContext::ParseMessage
                                (pPVar1,&msg_00->super_MessageLite,(char *)ctx_local);
          if (ctx_local == (ParseContext *)0x0) {
            return (char *)(ParseContext *)0x0;
          }
          bVar2 = google::protobuf::internal::EpsCopyInputStream::DataAvailable
                            (&pPStack_20->super_EpsCopyInputStream,(char *)ctx_local);
        } while ((bVar2) &&
                (bVar2 = google::protobuf::internal::ExpectTag<26u>((char *)ctx_local), bVar2));
        goto LAB_0047dddf;
      }
      break;
    default:
      break;
    case 10:
      if ((str._4_4_ & 0xff) == 0x52) {
        psVar5 = _internal_mutable_regressioninputfeaturename_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::InlineGreedyStringParser
                              (psVar5,(char *)ctx_local,pPStack_20);
        uVar3 = google::protobuf::internal::VerifyUTF8(psVar5,(char *)0x0);
joined_r0x0047e26a:
        if (((uVar3 ^ 0xff) & 1) != 0) {
          return (char *)(ParseContext *)0x0;
        }
        goto joined_r0x0047e27f;
      }
      break;
    case 0xb:
      if ((str._4_4_ & 0xff) == 0x5a) {
        psVar5 = _internal_mutable_optimisminputfeaturename_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::InlineGreedyStringParser
                              (psVar5,(char *)ctx_local,pPStack_20);
        uVar3 = google::protobuf::internal::VerifyUTF8(psVar5,(char *)0x0);
        goto joined_r0x0047e26a;
      }
      break;
    case 0xc:
      if ((str._4_4_ & 0xff) == 0x62) {
        psVar5 = _internal_mutable_samplingscaleinputfeaturename_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::InlineGreedyStringParser
                              (psVar5,(char *)ctx_local,pPStack_20);
        uVar3 = google::protobuf::internal::VerifyUTF8(psVar5,(char *)0x0);
        goto joined_r0x0047e26a;
      }
      break;
    case 0xd:
      if ((str._4_4_ & 0xff) == 0x6a) {
        psVar5 = _internal_mutable_samplingtruncationinputfeaturename_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::InlineGreedyStringParser
                              (psVar5,(char *)ctx_local,pPStack_20);
        uVar3 = google::protobuf::internal::VerifyUTF8(psVar5,(char *)0x0);
        goto joined_r0x0047e26a;
      }
      break;
    case 0x14:
      if ((str._4_4_ & 0xff) == 0xa2) {
        psVar5 = _internal_mutable_meanoutputfeaturename_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::InlineGreedyStringParser
                              (psVar5,(char *)ctx_local,pPStack_20);
        uVar3 = google::protobuf::internal::VerifyUTF8(psVar5,(char *)0x0);
        goto joined_r0x0047e26a;
      }
      break;
    case 0x15:
      if ((str._4_4_ & 0xff) == 0xaa) {
        psVar5 = _internal_mutable_varianceoutputfeaturename_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::InlineGreedyStringParser
                              (psVar5,(char *)ctx_local,pPStack_20);
        uVar3 = google::protobuf::internal::VerifyUTF8(psVar5,(char *)0x0);
        goto joined_r0x0047e26a;
      }
      break;
    case 0x16:
      if ((str._4_4_ & 0xff) == 0xb2) {
        psVar5 = _internal_mutable_pessimisticprobabilityoutputfeaturename_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::InlineGreedyStringParser
                              (psVar5,(char *)ctx_local,pPStack_20);
        uVar3 = google::protobuf::internal::VerifyUTF8(psVar5,(char *)0x0);
        goto joined_r0x0047e26a;
      }
      break;
    case 0x17:
      if ((str._4_4_ & 0xff) == 0xba) {
        psVar5 = _internal_mutable_sampledprobabilityoutputfeaturename_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::InlineGreedyStringParser
                              (psVar5,(char *)ctx_local,pPStack_20);
        uVar3 = google::protobuf::internal::VerifyUTF8(psVar5,(char *)0x0);
        goto joined_r0x0047e26a;
      }
    }
    if ((str._4_4_ == 0) || ((str._4_4_ & 7) == 4)) {
      if (ctx_local == (ParseContext *)0x0) {
        return (char *)(ParseContext *)0x0;
      }
      google::protobuf::internal::EpsCopyInputStream::SetLastTag
                (&pPStack_20->super_EpsCopyInputStream,str._4_4_);
      return (char *)ctx_local;
    }
    unknown = google::protobuf::internal::InternalMetadata::
              mutable_unknown_fields<std::__cxx11::string>
                        (&(this->super_MessageLite)._internal_metadata_);
    ctx_local = (ParseContext *)
                google::protobuf::internal::UnknownFieldParse
                          (tag_00,unknown,(char *)ctx_local,pPStack_20);
joined_r0x0047e27f:
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)(ParseContext *)0x0;
    }
  } while( true );
}

Assistant:

const char* BayesianProbitRegressor::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // uint32 numberOfFeatures = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          numberoffeatures_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.BayesianProbitRegressor.Gaussian bias = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr = ctx->ParseMessage(_internal_mutable_bias(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.BayesianProbitRegressor.FeatureWeight features = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_features(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else
          goto handle_unusual;
        continue;
      // string regressionInputFeatureName = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 82)) {
          auto str = _internal_mutable_regressioninputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string optimismInputFeatureName = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 90)) {
          auto str = _internal_mutable_optimisminputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string samplingScaleInputFeatureName = 12;
      case 12:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 98)) {
          auto str = _internal_mutable_samplingscaleinputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string samplingTruncationInputFeatureName = 13;
      case 13:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 106)) {
          auto str = _internal_mutable_samplingtruncationinputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string meanOutputFeatureName = 20;
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 162)) {
          auto str = _internal_mutable_meanoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string varianceOutputFeatureName = 21;
      case 21:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 170)) {
          auto str = _internal_mutable_varianceoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string pessimisticProbabilityOutputFeatureName = 22;
      case 22:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 178)) {
          auto str = _internal_mutable_pessimisticprobabilityoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string sampledProbabilityOutputFeatureName = 23;
      case 23:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 186)) {
          auto str = _internal_mutable_sampledprobabilityoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}